

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O1

EncodingResult<kj::Array<unsigned_char>_> *
kj::decodeHex(EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,
             ArrayPtr<const_char> text)

{
  uchar *puVar1;
  ulong uVar2;
  ulong extraout_RDX;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong in_R9;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  Iterator __end1;
  ulong elementCount;
  bool bVar11;
  bool bVar12;
  
  uVar2 = text.size_;
  elementCount = uVar2 >> 1;
  uVar7 = 0;
  uVar4 = elementCount;
  puVar1 = (uchar *)_::HeapArrayDisposer::allocateImpl
                              (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                               (_func_void_void_ptr *)0x0);
  if (1 < uVar2) {
    uVar6 = 0;
    uVar3 = extraout_RDX;
    do {
      bVar9 = text.ptr[uVar6 * 2];
      if ((byte)(bVar9 - 0x30) < 10) {
        uVar10 = bVar9 - 0x30;
LAB_001e3f9b:
        bVar11 = true;
        in_R9 = (ulong)uVar10;
      }
      else {
        if ((byte)(bVar9 + 0x9f) < 6) {
          uVar10 = bVar9 - 0x57;
          goto LAB_001e3f9b;
        }
        bVar11 = (byte)(bVar9 + 0xbf) < 6;
        in_R9 = in_R9 & 0xffffffff;
        if (bVar11) {
          in_R9 = (ulong)(bVar9 - 0x37);
        }
      }
      uVar3 = uVar3 & 0xffffffff;
      if (bVar11) {
        uVar3 = in_R9;
      }
      bVar9 = (char)uVar3 << 4;
      if (!bVar11) {
        bVar9 = 0;
      }
      bVar8 = text.ptr[uVar6 * 2 + 1];
      if ((byte)(bVar8 - 0x30) < 10) {
        uVar10 = bVar8 - 0x30;
LAB_001e3ff2:
        bVar12 = true;
        uVar7 = (ulong)uVar10;
      }
      else {
        if ((byte)(bVar8 + 0x9f) < 6) {
          uVar10 = bVar8 - 0x57;
          goto LAB_001e3ff2;
        }
        bVar12 = (byte)(bVar8 + 0xbf) < 6;
        uVar7 = uVar7 & 0xffffffff;
        if (bVar12) {
          uVar7 = (ulong)(bVar8 - 0x37);
        }
      }
      uVar2 = uVar2 & 0xff;
      if (!bVar11) {
        uVar2 = 1;
      }
      uVar5 = uVar4 & 0xffffffff;
      uVar4 = uVar7;
      if (!bVar12) {
        uVar2 = 1;
        uVar4 = uVar5;
      }
      bVar8 = 0;
      if (bVar12) {
        bVar8 = (byte)uVar4;
      }
      puVar1[uVar6] = bVar8 | bVar9;
      uVar6 = uVar6 + 1;
    } while (elementCount != uVar6);
  }
  (__return_storage_ptr__->super_Array<unsigned_char>).ptr = puVar1;
  (__return_storage_ptr__->super_Array<unsigned_char>).size_ = elementCount;
  (__return_storage_ptr__->super_Array<unsigned_char>).disposer =
       (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  __return_storage_ptr__->hadErrors = (bool)((byte)uVar2 & 1);
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<byte>> decodeHex(ArrayPtr<const char> text) {
  auto result = heapArray<byte>(text.size() / 2);
  bool hadErrors = text.size() % 2;

  for (auto i: kj::indices(result)) {
    byte b = 0;
    KJ_IF_SOME(d1, tryFromHexDigit(text[i*2])) {
      b = d1 << 4;
    } else {
      hadErrors = true;
    }
    KJ_IF_SOME(d2, tryFromHexDigit(text[i*2+1])) {
      b |= d2;
    } else {
      hadErrors = true;
    }